

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O3

bool tcu::verifyPointGroupRasterization
               (Surface *surface,PointSceneSpec *scene,RasterizationArguments *args,TestLog *log)

{
  undefined4 uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Vec4 *pVVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  pointer pSVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined1 auVar19 [16];
  float fVar20;
  float fVar24;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  float fVar25;
  float fVar28;
  float fVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar30;
  TriangleSceneSpec triangleScene;
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  local_68;
  undefined8 local_48;
  undefined8 uStack_40;
  ulong uVar21;
  
  local_48._0_4_ = surface->m_width;
  local_48._4_4_ = surface->m_height;
  uStack_40 = 0;
  local_68.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.
  super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
  ::resize(&local_68,
           ((long)(scene->points).
                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(scene->points).
                  super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 2) * 0x1c71c71c71c71c72);
  pSVar11 = (scene->points).
            super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(scene->points).
                              super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11) >> 2) *
          0x38e38e39) {
    fVar13 = (float)(int)local_48;
    fVar14 = (float)local_48._4_4_;
    fVar15 = (float)(int)uStack_40;
    fVar16 = (float)uStack_40._4_4_;
    iVar7 = 1;
    lVar8 = 0;
    lVar9 = 0;
    lVar10 = 0;
    do {
      fVar17 = *(float *)((long)(&pSVar11->color + 1) + lVar8) * 0.5;
      lVar12 = lVar9 >> 0x20;
      auVar26._8_8_ = 0;
      auVar26._0_8_ = *(ulong *)((long)(pSVar11->position).m_data + lVar8);
      uVar1 = *(undefined4 *)((long)(pSVar11->position).m_data + lVar8 + 0xc);
      auVar22._4_4_ = uVar1;
      auVar22._0_4_ = uVar1;
      auVar22._8_4_ = uVar1;
      auVar22._12_4_ = uVar1;
      auVar27 = divps(auVar26,auVar22);
      fVar25 = (auVar27._0_4_ + 1.0) * 0.5 * fVar13;
      fVar28 = (auVar27._4_4_ + 1.0) * 0.5 * fVar14;
      fVar29 = (auVar27._8_4_ + 0.0) * 0.0 * fVar15;
      fVar30 = (auVar27._12_4_ + 0.0) * 0.0 * fVar16;
      auVar23._0_4_ = fVar25 - fVar17;
      auVar23._4_4_ = fVar28 - fVar17;
      auVar23._8_4_ = fVar29 - fVar17;
      auVar23._12_4_ = fVar30 - fVar17;
      auVar27._4_4_ = fVar14;
      auVar27._0_4_ = fVar13;
      auVar27._8_4_ = fVar15;
      auVar27._12_4_ = fVar16;
      auVar27 = divps(auVar23,auVar27);
      fVar20 = auVar27._0_4_ + auVar27._0_4_ + -1.0;
      fVar24 = auVar27._4_4_ + auVar27._4_4_ + -1.0;
      uVar21 = CONCAT44(fVar24,fVar20);
      auVar3._8_4_ = 0;
      auVar3._0_8_ = uVar21;
      auVar3._12_4_ = 0x3f800000;
      *(undefined1 (*) [16])
       local_68.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[lVar12].positions[0].m_data = auVar3;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].sharedEdge[0] = false;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].positions[1].m_data[0] = fVar20;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].positions[1].m_data[2] = 0.0;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].positions[1].m_data[3] = 1.0;
      auVar19._0_4_ = fVar17 + fVar25;
      auVar19._4_4_ = fVar17 + fVar28;
      auVar19._8_4_ = fVar17 + fVar29;
      auVar19._12_4_ = fVar17 + fVar30;
      auVar2._4_4_ = fVar14;
      auVar2._0_4_ = fVar13;
      auVar2._8_4_ = fVar15;
      auVar2._12_4_ = fVar16;
      auVar27 = divps(auVar19,auVar2);
      fVar17 = auVar27._0_4_ + auVar27._0_4_ + -1.0;
      fVar20 = auVar27._4_4_ + auVar27._4_4_ + -1.0;
      uVar18 = CONCAT44(fVar20,fVar17);
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].positions[1].m_data[1] = fVar20;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].sharedEdge[1] = false;
      pVVar5 = local_68.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start[lVar12].positions;
      *(undefined8 *)pVVar5[2].m_data = uVar18;
      pVVar5[2].m_data[2] = 0.0;
      pVVar5[2].m_data[3] = 1.0;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[lVar12].sharedEdge[2] = true;
      auVar4._8_4_ = 0;
      auVar4._0_8_ = uVar21;
      auVar4._12_4_ = 0x3f800000;
      *(undefined1 (*) [16])
       local_68.
       super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
       ._M_impl.super__Vector_impl_data._M_start[iVar7].positions[0].m_data = auVar4;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].sharedEdge[0] = true;
      pVVar5 = local_68.
               super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
               ._M_impl.super__Vector_impl_data._M_start[iVar7].positions;
      *(undefined8 *)pVVar5[1].m_data = uVar18;
      pVVar5[1].m_data[2] = 0.0;
      pVVar5[1].m_data[3] = 1.0;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].sharedEdge[1] = false;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].positions[2].m_data[0] = fVar17;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].positions[2].m_data[1] = fVar24;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].positions[2].m_data[2] = 0.0;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].positions[2].m_data[3] = 1.0;
      local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start[iVar7].sharedEdge[2] = false;
      lVar10 = lVar10 + 1;
      pSVar11 = (scene->points).
                super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                ._M_impl.super__Vector_impl_data._M_start;
      iVar7 = iVar7 + 2;
      lVar9 = lVar9 + 0x200000000;
      lVar8 = lVar8 + 0x24;
    } while (lVar10 < (int)((ulong)((long)(scene->points).
                                          super__Vector_base<tcu::PointSceneSpec::ScenePoint,_std::allocator<tcu::PointSceneSpec::ScenePoint>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pSVar11
                                   ) >> 2) * 0x38e38e39);
  }
  bVar6 = verifyTriangleGroupRasterization
                    (surface,(TriangleSceneSpec *)&local_68,args,log,VERIFICATIONMODE_STRICT);
  if (local_68.
      super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.
                    super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_68.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.
                          super__Vector_base<tcu::TriangleSceneSpec::SceneTriangle,_std::allocator<tcu::TriangleSceneSpec::SceneTriangle>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool verifyPointGroupRasterization (const tcu::Surface& surface, const PointSceneSpec& scene, const RasterizationArguments& args, tcu::TestLog& log)
{
	// Splitting to triangles is a valid solution in multisampled cases and even in non-multisample cases too.
	return verifyMultisamplePointGroupRasterization(surface, scene, args, log);
}